

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# File.cpp
# Opt level: O3

bool File::isAbsolutePath(String *path)

{
  bool bVar1;
  char *pcVar2;
  
  pcVar2 = String::operator_cast_to_char_(path);
  bVar1 = true;
  if ((*pcVar2 != '/') && (*pcVar2 != '\\')) {
    if ((path->data->len < 3) || (pcVar2[1] != ':')) {
      bVar1 = false;
    }
    else {
      bVar1 = pcVar2[2] == '\\' || pcVar2[2] == '/';
    }
  }
  return bVar1;
}

Assistant:

bool File::isAbsolutePath(const String& path)
{
  const char* data = path;
  return *data == '/' || *data == '\\' || (path.length() > 2 && data[1] == ':' && (data[2] == '/' || data[2] == '\\'));
}